

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  uint *puVar1;
  int iVar2;
  int i;
  long lVar3;
  ulong uVar4;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
      return;
    }
    iVar2 = this->used_digits_;
    if (iVar2 != 0) {
      puVar1 = (this->bigits_).start_;
      uVar4 = 0;
      for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
        uVar4 = (ulong)puVar1[lVar3] * (ulong)factor + uVar4;
        puVar1[lVar3] = (uint)uVar4 & 0xfffffff;
        uVar4 = uVar4 >> 0x1c;
        iVar2 = this->used_digits_;
      }
      puVar1 = (this->bigits_).start_;
      for (; uVar4 != 0; uVar4 = uVar4 >> 0x1c) {
        if (0x7f < iVar2) {
          abort();
        }
        puVar1[iVar2] = (uint)uVar4 & 0xfffffff;
        iVar2 = this->used_digits_ + 1;
        this->used_digits_ = iVar2;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}